

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>
               (void)

{
  _List_node_base *__args;
  uint *__args_1;
  undefined8 uVar1;
  undefined8 uVar2;
  _Base_ptr p_Var3;
  uint uVar4;
  bool bVar5;
  Column_zp_settings *this;
  _Rb_tree_node_base *p_Var6;
  undefined1 *puVar7;
  witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false>_>_>_>
  *witness;
  uint rowIndex;
  _List_node_base *p_Var8;
  undefined4 local_504;
  undefined4 *local_500;
  _Base_ptr local_4f8;
  undefined **local_4f0;
  ulong local_4e8;
  shared_count sStack_4e0;
  undefined4 **local_4d8;
  undefined8 local_4d0;
  uint local_4c8 [2];
  undefined8 *local_4c0;
  _Base_ptr *local_4b8;
  undefined1 local_4b0 [8];
  undefined8 local_4a8;
  shared_count sStack_4a0;
  char *local_498;
  char *local_490;
  undefined **local_488;
  char *local_480;
  undefined8 *local_478;
  char *local_470;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_408;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  m.colSettings_ = this;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>
  ::
  Chain_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>
              *)&m.matrix_,&local_408,this);
  build_longer_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>>
            ();
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       local_408.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_408.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  bars1._M_t._M_impl._0_8_ =
       local_408.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_408.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_408.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bars2._M_t._M_impl._0_8_;
  local_408.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&bars1);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&bars2);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>
            (&local_408,&m);
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  build_longer_chain_row_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>>
            ();
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  uVar1 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars1._M_t._M_impl._0_8_ = bars2._M_t._M_impl._0_8_;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  bars2._M_t._M_impl._0_8_ = bars3._M_t._M_impl._0_8_;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  uVar2 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)uVar1;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = SUB84(uVar1,4);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  bars3._M_t._M_impl._0_8_ = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uVar2;
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&bars1);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&bars3);
  uVar1 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  if (bars2._M_t._M_impl._0_8_ != bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_) {
    rowIndex = 0;
    witness = (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false>_>_>_>
               *)bars2._M_t._M_impl._0_8_;
    do {
      uVar4 = 6;
      if (rowIndex != 6) {
        get_ordered_row<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>
                  ((column_content<typename_Matrix<Chain_rep_options_with_row_access<false,_(Column_types)7,_true,_true,_false,_true,_false,_false>_>::Column>
                    *)&bars1,&m,rowIndex);
        test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>>
                  (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false>_>_>_>
                            *)&bars1);
        std::
        _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&bars1);
        uVar4 = rowIndex + 1;
      }
      rowIndex = uVar4;
      witness = witness + 1;
    } while (witness !=
             (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false>_>_>_>
              *)uVar1);
  }
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&bars2);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((Underlying_matrix *)
      m.matrix_.super_Chain_pairing_option.barcode_.
      super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != &m.matrix_) {
    p_Var8 = m.matrix_.super_Chain_pairing_option.barcode_.
             super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    do {
      __args = p_Var8 + 1;
      __args_1 = (uint *)((long)&p_Var8[1]._M_next + 4);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,(int *)__args,__args_1,(uint *)&p_Var8[1]._M_prev);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,(int *)__args,__args_1,(uint *)&p_Var8[1]._M_prev);
      local_4c8[0] = *(uint *)&p_Var8[1]._M_prev;
      local_4d0 = (undefined **)__args->_M_next;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_4d0,(uint *)((long)&local_4d0 + 4),local_4c8);
      p_Var8 = p_Var8->_M_next;
    } while ((Underlying_matrix *)p_Var8 != &m.matrix_);
  }
  p_Var3 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x574);
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_4f8 = (_Base_ptr)&p_Var3[1]._M_parent;
  local_500 = &local_504;
  local_504 = 0;
  local_4b0[0] = *(int *)&p_Var3[1]._M_parent == 0;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4b8 = &local_4f8;
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4d8 = &local_500;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x575);
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 0;
  local_4b0[0] = *(int *)&p_Var3[1].field_0x4 == 0;
  local_4f8 = (_Base_ptr)&p_Var3[1].field_0x4;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x577);
  local_4f8 = p_Var3 + 1;
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 0xffffffff;
  local_4b0[0] = local_4f8->_M_color == ~_S_red;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x579);
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 0;
  local_4b0[0] = *(int *)&p_Var6[1]._M_parent == 0;
  local_4f8 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x57a);
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 1;
  local_4b0[0] = *(int *)&p_Var6[1].field_0x4 == 1;
  local_4f8 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x57b);
  local_4f8 = p_Var6 + 1;
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 3;
  local_4b0[0] = local_4f8->_M_color == 3;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x57d);
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 0;
  local_4b0[0] = *(int *)&p_Var6[1]._M_parent == 0;
  local_4f8 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x57e);
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 2;
  local_4b0[0] = *(int *)&p_Var6[1].field_0x4 == 2;
  local_4f8 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x57f);
  local_4f8 = p_Var6 + 1;
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 4;
  local_4b0[0] = local_4f8->_M_color == 4;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_278,0x581);
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 0;
  local_4b0[0] = *(int *)&p_Var6[1]._M_parent == 0;
  local_4f8 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x582);
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 7;
  local_4b0[0] = *(int *)&p_Var6[1].field_0x4 == 7;
  local_4f8 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b8,0x583);
  local_4f8 = p_Var6 + 1;
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 8;
  local_4b0[0] = local_4f8->_M_color == 8;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d8,0x585);
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 1;
  local_4b0[0] = *(int *)&p_Var6[1]._M_parent == 1;
  local_4f8 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x586);
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 5;
  local_4b0[0] = *(int *)&p_Var6[1].field_0x4 == 5;
  local_4f8 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_318,0x587);
  local_4f8 = p_Var6 + 1;
  local_480 = (char *)((ulong)local_480 & 0xffffffffffffff00);
  local_488 = &PTR__lazy_ostream_002371e8;
  local_478 = &boost::unit_test::lazy_ostream::inst;
  local_470 = "";
  local_504 = 6;
  local_4b0[0] = local_4f8->_M_color == 6;
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_002371a8;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = &local_4f8;
  local_500 = &local_504;
  local_4e8 = local_4e8 & 0xffffffffffffff00;
  local_4f0 = &PTR__lazy_ostream_002371a8;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_500;
  boost::test_tools::tt_detail::report_assertion
            (local_4b0,&local_488,&local_498,0x587,1,2,2,"std::get<2>(*it)",&local_4d0,"6",
             &local_4f0);
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  puVar7 = (undefined1 *)std::_Rb_tree_increment(p_Var6);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_338,0x589);
  local_4f0 = (undefined **)
              CONCAT71(local_4f0._1_7_,
                       (_Rb_tree_header *)puVar7 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_4e8 = 0;
  sStack_4e0.pi_ = (sp_counted_base *)0x0;
  local_488 = (undefined **)0x1f86db;
  local_480 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_00237328;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_350 = "";
  local_4b8 = (_Base_ptr *)&local_488;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4e0);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_368,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar5 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar5 = false;
  }
  local_4f0 = (undefined **)CONCAT71(local_4f0._1_7_,bVar5);
  local_4e8 = 0;
  sStack_4e0.pi_ = (sp_counted_base *)0x0;
  local_488 = (undefined **)0x1f86ed;
  local_480 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_00237328;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_380 = "";
  local_4b8 = (_Base_ptr *)&local_488;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4e0);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_390 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_398,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar5 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar5 = false;
  }
  local_4f0 = (undefined **)CONCAT71(local_4f0._1_7_,bVar5);
  local_4e8 = 0;
  sStack_4e0.pi_ = (sp_counted_base *)0x0;
  local_488 = (undefined **)0x1f86fc;
  local_480 = "";
  local_4c8[0] = local_4c8[0] & 0xffffff00;
  local_4d0 = &PTR__lazy_ostream_00237328;
  local_4c0 = &boost::unit_test::lazy_ostream::inst;
  local_4b8 = (_Base_ptr *)&local_488;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4e0);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_408);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}